

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_BanDatabase.cpp
# Opt level: O3

void __thiscall
RenX::BanDatabase::add
          (BanDatabase *this,Server *server,PlayerInfo *player,string_view banner,string_view reason
          ,seconds length,uint16_t flags)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  pointer ppPVar3;
  _Head_base<0UL,_RenX::BanDatabase::Entry_*,_false> _Var4;
  BanDatabase *this_00;
  byte bVar5;
  Entry *__s;
  rep rVar6;
  Core *this_01;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *pvVar7;
  key_type *__k;
  mapped_type *this_02;
  size_type sVar8;
  char *__s_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  void *__buf;
  pointer ppPVar10;
  size_type sVar11;
  _Head_base<0UL,_RenX::BanDatabase::Entry_*,_false> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  BanDatabase *local_48;
  size_t local_40;
  Server *local_38;
  
  local_40 = banner._M_len;
  local_48 = this;
  local_38 = server;
  __s = (Entry *)operator_new(0x110);
  memset(__s,0,0x100);
  (__s->hwid)._M_dataplus._M_p = (pointer)&(__s->hwid).field_2;
  (__s->rdns)._M_dataplus._M_p = (pointer)&(__s->rdns).field_2;
  (__s->name)._M_dataplus._M_p = (pointer)&(__s->name).field_2;
  (__s->banner)._M_dataplus._M_p = (pointer)&(__s->banner).field_2;
  (__s->reason)._M_dataplus._M_p = (pointer)&(__s->reason).field_2;
  (__s->varData)._M_h._M_buckets = &(__s->varData)._M_h._M_single_bucket;
  (__s->varData)._M_h._M_bucket_count = 1;
  (__s->varData)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__s->varData)._M_h._M_element_count = 0;
  (__s->varData)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__s->varData)._M_h._M_rehash_policy._M_next_resize = 0;
  (__s->varData)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (flags != 0) {
    __s->flags = flags | 0x8000;
  }
  local_70._M_head_impl = __s;
  rVar6 = std::chrono::_V2::system_clock::now();
  (__s->timestamp).__d.__r = rVar6;
  (__s->length).__r = length.__r;
  __s->steamid = player->steamid;
  __s->ip = player->ip32;
  __s->prefix_length = ' ';
  sVar11 = (player->hwid)._M_string_length;
  if (sVar11 != 0) {
    sVar8 = 0;
    do {
      if ((player->hwid)._M_dataplus._M_p[sVar8] != '0') {
        if (sVar8 != 0xffffffffffffffff) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&__s->hwid,&player->hwid);
        }
        break;
      }
      sVar8 = sVar8 + 1;
    } while (sVar11 != sVar8);
  }
  p_Var1 = (player->m_rdns_ptr).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    sVar11 = 0;
    __s_00 = (char *)0x0;
    if (p_Var1->_M_use_count != 1) goto LAB_0011d899;
    peVar2 = (player->m_rdns_ptr).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (peVar2 != (element_type *)0x0) {
      __s_00 = (peVar2->_M_dataplus)._M_p;
      sVar11 = peVar2->_M_string_length;
      goto LAB_0011d899;
    }
  }
  sVar11 = 0;
  __s_00 = (char *)0x0;
LAB_0011d899:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&(local_70._M_head_impl)->rdns,0,((local_70._M_head_impl)->rdns)._M_string_length,
             __s_00,sVar11);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&(local_70._M_head_impl)->name,&player->name);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&(local_70._M_head_impl)->banner,0,((local_70._M_head_impl)->banner)._M_string_length,
             banner._M_str,local_40);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&(local_70._M_head_impl)->reason,0,((local_70._M_head_impl)->reason)._M_string_length,
             reason._M_str,reason._M_len);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  this_01 = getCore();
  pvVar7 = Core::getPlugins(this_01);
  ppPVar10 = (pvVar7->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppPVar3 = (pvVar7->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppPVar10 != ppPVar3) {
    do {
      pbVar9 = &local_68;
      bVar5 = (**(code **)(*(long *)*ppPVar10 + 0x130))(*ppPVar10,local_38,player,&local_68);
      _Var4._M_head_impl = local_70._M_head_impl;
      reason._M_str = (char *)CONCAT71((int7)((ulong)pbVar9 >> 8),local_68._M_string_length != 0);
      if ((bVar5 & local_68._M_string_length != 0) == 1) {
        __k = (key_type *)Jupiter::Plugin::getName_abi_cxx11_();
        this_02 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_jessilib::text_equal,_jessilib::text_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_jessilib::text_equal,_jessilib::text_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&(_Var4._M_head_impl)->varData,__k);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_02,&local_68);
      }
      ppPVar10 = ppPVar10 + 1;
    } while (ppPVar10 != ppPVar3);
  }
  this_00 = local_48;
  std::
  vector<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>,std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>>>
  ::
  emplace_back<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>>
            ((vector<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>,std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>>>
              *)&local_48->m_entries,
             (unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_> *
             )&local_70);
  write(this_00,(int)(this_00->m_entries).
                     super__Vector_base<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                     super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                     .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl,__buf,
        (size_t)reason._M_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>::
  ~unique_ptr((unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
               *)&local_70);
  return;
}

Assistant:

void RenX::BanDatabase::add(RenX::Server *server, const RenX::PlayerInfo &player, std::string_view banner, std::string_view reason, std::chrono::seconds length, uint16_t flags) {
	std::unique_ptr<Entry> entry = std::make_unique<Entry>();
	if (flags != 0) {
		entry->set_active();
		entry->flags |= flags;
	}
	entry->timestamp = std::chrono::system_clock::now();
	entry->length = length;
	entry->steamid = player.steamid;
	entry->ip = player.ip32;
	entry->prefix_length = 32U;
	if (player.hwid.find_first_not_of('0') != std::string::npos) {
		entry->hwid = player.hwid;
	}
	entry->rdns = player.get_rdns();
	entry->name = player.name;
	entry->banner = banner;
	entry->reason = reason;

	// add plugin data
	std::string pluginData;
	for (Plugin* plugin : RenX::getCore()->getPlugins()) {
		if (plugin->RenX_OnBan(*server, player, pluginData)) {
			if (!pluginData.empty()) {
				entry->varData[plugin->getName()] = pluginData;
			}
		}
	}

	m_entries.push_back(std::move(entry));
	write(m_entries.back().get());
}